

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemAccessors
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var getter,Var setter)

{
  Type *addr;
  JavascriptLibrary *pJVar1;
  IndexPropertyDescriptorMap *this_00;
  IndexPropertyDescriptor *pIVar2;
  bool bVar3;
  BOOL BVar4;
  IndexPropertyDescriptor *setter_00;
  undefined1 local_70 [8];
  int i;
  uint32 local_54;
  DynamicObject *local_50;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  Var local_38;
  
  if ((this->lengthWritable != false) ||
     (BVar4 = 0, index < (arr->super_JavascriptArray).super_ArrayObject.length)) {
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    local_50 = instance;
    if (getter == (Var)0x0) {
      local_38 = (Var)0x0;
    }
    else {
      local_38 = DynamicTypeHandler::CanonicalizeAccessor(getter,pJVar1);
    }
    if (setter == (Var)0x0) {
      setter_00 = (IndexPropertyDescriptor *)0x0;
    }
    else {
      setter_00 = (IndexPropertyDescriptor *)DynamicTypeHandler::CanonicalizeAccessor(setter,pJVar1)
      ;
    }
    JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
    local_54 = index;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_54,&local_48,
                       (int *)local_70);
    pIVar2 = local_48;
    if (bVar3) {
      if ((local_48->Attributes & 8) != 0) {
        local_48->Attributes = '\a';
      }
      descriptor = setter_00;
      if (local_38 != (Var)0x0) {
        addr = &local_48->Getter;
        Memory::Recycler::WBSetBit((char *)addr);
        (pIVar2->Getter).ptr = local_38;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      if (descriptor != (IndexPropertyDescriptor *)0x0) {
        Memory::Recycler::WBSetBit((char *)&local_48->Setter);
        (local_48->Setter).ptr = descriptor;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48->Setter);
      }
    }
    else {
      this_00 = (this->indexPropertyMap).ptr;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)local_70,local_38,setter_00);
      IndexPropertyDescriptorMap::Add(this_00,index,(IndexPropertyDescriptor *)local_70);
    }
    if ((arr->super_JavascriptArray).super_ArrayObject.length <= index) {
      if (index + 1 == 0) {
        ::Math::DefaultOverflowPolicy();
      }
      JavascriptArray::SetLength(&arr->super_JavascriptArray,index + 1);
    }
    DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false);
    if (((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0) {
      pJVar1 = (((local_50->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::Recycler::WBSetBit(local_70);
      local_70 = (undefined1  [8])&pJVar1->typesWithOnlyWritablePropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_70);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_70);
    }
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var getter, Var setter)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        JavascriptLibrary* lib = instance->GetLibrary();
        if (getter)
        {
            getter = this->CanonicalizeAccessor(getter, lib);
        }
        if (setter)
        {
            setter = this->CanonicalizeAccessor(setter, lib);
        }

        // conversion from data-property to accessor property
        arr->DirectDeleteItemAt<Var>(index);

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }
            if (getter)
            {
                descriptor->Getter = getter;
            }
            if (setter)
            {
                descriptor->Setter = setter;
            }
        }
        else
        {
            indexPropertyMap->Add(index, IndexPropertyDescriptor(getter, setter));
        }

        if (arr->GetLength() <= index)
        {
            uint32 newLength = index;
            UInt32Math::Inc(newLength);
            arr->SetLength(newLength);
        }

        this->ClearHasOnlyWritableDataProperties();
        if(this->GetFlags() & this->IsPrototypeFlag)
        {
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
        return true;
    }